

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::Generate
          (ReflectionClassGenerator *this,Printer *printer)

{
  int iVar1;
  int iVar2;
  EnumDescriptor *descriptor;
  Options *pOVar3;
  Descriptor *descriptor_00;
  ulong uVar4;
  undefined1 local_a0 [8];
  MessageGenerator messageGenerator;
  int i_1;
  undefined1 local_40 [8];
  EnumGenerator enumGenerator;
  int i;
  Printer *printer_local;
  ReflectionClassGenerator *this_local;
  
  WriteIntroduction(this,printer);
  WriteDescriptor(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  iVar1 = FileDescriptor::enum_type_count(this->file_);
  if (0 < iVar1) {
    io::Printer::Print(printer,"#region Enums\n");
    enumGenerator.descriptor_._4_4_ = 0;
    while( true ) {
      iVar1 = enumGenerator.descriptor_._4_4_;
      iVar2 = FileDescriptor::enum_type_count(this->file_);
      if (iVar2 <= iVar1) break;
      descriptor = FileDescriptor::enum_type(this->file_,enumGenerator.descriptor_._4_4_);
      pOVar3 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
      EnumGenerator::EnumGenerator((EnumGenerator *)local_40,descriptor,pOVar3);
      EnumGenerator::Generate((EnumGenerator *)local_40,printer);
      EnumGenerator::~EnumGenerator((EnumGenerator *)local_40);
      enumGenerator.descriptor_._4_4_ = enumGenerator.descriptor_._4_4_ + 1;
    }
    io::Printer::Print(printer,"#endregion\n");
    io::Printer::Print(printer,"\n");
  }
  iVar1 = FileDescriptor::message_type_count(this->file_);
  if (0 < iVar1) {
    io::Printer::Print(printer,"#region Messages\n");
    messageGenerator.fields_by_number_.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    while( true ) {
      iVar1 = (int)messageGenerator.fields_by_number_.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar2 = FileDescriptor::message_type_count(this->file_);
      if (iVar2 <= iVar1) break;
      descriptor_00 =
           FileDescriptor::message_type
                     (this->file_,
                      (int)messageGenerator.fields_by_number_.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pOVar3 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
      MessageGenerator::MessageGenerator((MessageGenerator *)local_a0,descriptor_00,pOVar3);
      MessageGenerator::Generate((MessageGenerator *)local_a0,printer);
      MessageGenerator::~MessageGenerator((MessageGenerator *)local_a0);
      messageGenerator.fields_by_number_.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)messageGenerator.fields_by_number_.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
    }
    io::Printer::Print(printer,"#endregion\n");
    io::Printer::Print(printer,"\n");
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  io::Printer::Print(printer,"\n");
  io::Printer::Print(printer,"#endregion Designer generated code\n");
  return;
}

Assistant:

void ReflectionClassGenerator::Generate(io::Printer* printer) {
  WriteIntroduction(printer);

  WriteDescriptor(printer);
  // Close the class declaration.
  printer->Outdent();
  printer->Print("}\n");

  // write children: Enums
  if (file_->enum_type_count() > 0) {
    printer->Print("#region Enums\n");
    for (int i = 0; i < file_->enum_type_count(); i++) {
      EnumGenerator enumGenerator(file_->enum_type(i), this->options());
      enumGenerator.Generate(printer);
    }
    printer->Print("#endregion\n");
    printer->Print("\n");
  }

  // write children: Messages
  if (file_->message_type_count() > 0) {
    printer->Print("#region Messages\n");
    for (int i = 0; i < file_->message_type_count(); i++) {
      MessageGenerator messageGenerator(file_->message_type(i), this->options());
      messageGenerator.Generate(printer);
    }
    printer->Print("#endregion\n");
    printer->Print("\n");
  }

  // TODO(jtattermusch): add insertion point for services.

  if (!namespace_.empty()) {
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Print("\n");
  printer->Print("#endregion Designer generated code\n");
}